

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommonCore.cpp
# Opt level: O0

void __thiscall
helics::CommonCore::addSourceTarget
          (CommonCore *this,InterfaceHandle handle,string_view targetName,InterfaceType hint)

{
  GlobalHandle hand;
  string_view string2;
  string_view message;
  string_view message_00;
  string_view message_01;
  string_view string1;
  string_view message_02;
  bool bVar1;
  undefined8 uVar2;
  basic_string_view<char,_std::char_traits<char>_> *this_00;
  char *pcVar3;
  ulong uVar4;
  char in_R8B;
  ActionMessage cmd;
  pair<helics::route_id,_helics::ActionMessage> *handleInfo;
  CommonCore *in_stack_fffffffffffffe48;
  BrokerBase *in_stack_fffffffffffffe50;
  undefined7 in_stack_fffffffffffffe58;
  undefined1 in_stack_fffffffffffffe5f;
  ActionMessage *in_stack_fffffffffffffe60;
  size_t in_stack_fffffffffffffe68;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffe70;
  ActionMessage *this_01;
  ActionMessage local_110;
  pair<helics::route_id,_helics::ActionMessage> *local_30;
  char local_21;
  
  local_21 = in_R8B;
  local_30 = getHandleInfo(in_stack_fffffffffffffe48,
                           (InterfaceHandle)(BaseType)((ulong)in_stack_fffffffffffffe50 >> 0x20));
  if (local_30 == (pair<helics::route_id,_helics::ActionMessage> *)0x0) {
    uVar2 = __cxa_allocate_exception(0x28);
    CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
              ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe60,
               (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
    message._M_str = (char *)in_stack_fffffffffffffe70;
    message._M_len = in_stack_fffffffffffffe68;
    InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_fffffffffffffe60,message);
    __cxa_throw(uVar2,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
  }
  bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::EndpointFlags>(local_30,source_only_flag);
  if (!bVar1) {
    this_01 = &local_110;
    ActionMessage::ActionMessage(in_stack_fffffffffffffe60);
    hand.fed_id.gid = (local_30->first).rid;
    hand.handle.hid = *(BaseType *)&local_30->field_0x4;
    ActionMessage::setSource(this_01,hand);
    local_110.counter = (uint16_t)(char)(local_30->second).messageID;
    local_110.flags = *(uint16_t *)((long)&(local_30->second).messageID + 2);
    SmallBuffer::operator=((SmallBuffer *)this_01,in_stack_fffffffffffffe70);
    pcVar3 = (char *)(ulong)(byte)((char)(local_30->second).messageID + 0x9b);
    switch(pcVar3) {
    case (char *)0x0:
    case (char *)0xe:
      if (local_21 == 'f') {
        ActionMessage::setAction(&local_110,cmd_add_named_filter);
      }
      else if (local_21 == 'p') {
        ActionMessage::setAction(&local_110,cmd_add_named_publication);
      }
      else {
        ActionMessage::setAction(&local_110,cmd_add_named_endpoint);
      }
      break;
    case (char *)0x1:
      ActionMessage::setAction(&local_110,cmd_add_named_endpoint);
      bVar1 = CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
              empty((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x494fd2);
      if ((bVar1) &&
         ((bVar1 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x494fec), !bVar1 ||
          (bVar1 = CLI::std::__cxx11::
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::empty
                             ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              0x495003), !bVar1)))) {
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe50);
        std::__cxx11::string::operator_cast_to_basic_string_view
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   in_stack_fffffffffffffe50);
        string1._M_str = pcVar3;
        string1._M_len = in_stack_fffffffffffffe68;
        string2._M_len._7_1_ = in_stack_fffffffffffffe5f;
        string2._M_len._0_7_ = in_stack_fffffffffffffe58;
        string2._M_str = (char *)in_stack_fffffffffffffe60;
        ActionMessage::setStringData((ActionMessage *)in_stack_fffffffffffffe50,string1,string2);
      }
      bVar1 = checkActionFlag<helics::BasicHandleInfo,helics::FilterFlags>(local_30,clone_flag);
      if (bVar1) {
        setActionFlag<helics::ActionMessage,helics::FilterFlags>(&local_110,clone_flag);
      }
      break;
    case (char *)0x4:
      ActionMessage::setAction(&local_110,cmd_add_named_publication);
      break;
    case (char *)0xb:
    default:
      uVar2 = __cxa_allocate_exception(0x28);
      CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe60,
                 (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
      message_02._M_str = pcVar3;
      message_02._M_len = in_stack_fffffffffffffe68;
      InvalidIdentifier::InvalidIdentifier
                ((InvalidIdentifier *)in_stack_fffffffffffffe60,message_02);
      __cxa_throw(uVar2,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
    case (char *)0xf:
      uVar4 = (ulong)(byte)(local_21 + 0x9b);
      switch(uVar4) {
      case 0:
        ActionMessage::setAction(&local_110,cmd_add_named_endpoint);
        break;
      case 1:
        ActionMessage::setAction(&local_110,cmd_add_named_filter);
        break;
      default:
        ActionMessage::setAction(&local_110,cmd_add_named_publication);
        BrokerBase::addActionMessage
                  (in_stack_fffffffffffffe50,(ActionMessage *)in_stack_fffffffffffffe48);
        ActionMessage::setAction(&local_110,cmd_add_named_endpoint);
        break;
      case 4:
        this_00 = (basic_string_view<char,_std::char_traits<char>_> *)__cxa_allocate_exception(0x28)
        ;
        CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                  (this_00,(char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
        message_01._M_str = pcVar3;
        message_01._M_len = uVar4;
        InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)this_00,message_01);
        __cxa_throw(this_00,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
      case 0xb:
        ActionMessage::setAction(&local_110,cmd_add_named_publication);
      }
    }
    BrokerBase::addActionMessage
              (in_stack_fffffffffffffe50,(ActionMessage *)in_stack_fffffffffffffe48);
    ActionMessage::~ActionMessage((ActionMessage *)in_stack_fffffffffffffe50);
    return;
  }
  uVar2 = __cxa_allocate_exception(0x28);
  CLI::std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)in_stack_fffffffffffffe60,
             (char *)CONCAT17(in_stack_fffffffffffffe5f,in_stack_fffffffffffffe58));
  message_00._M_str = (char *)in_stack_fffffffffffffe70;
  message_00._M_len = in_stack_fffffffffffffe68;
  InvalidIdentifier::InvalidIdentifier((InvalidIdentifier *)in_stack_fffffffffffffe60,message_00);
  __cxa_throw(uVar2,&InvalidIdentifier::typeinfo,InvalidIdentifier::~InvalidIdentifier);
}

Assistant:

void CommonCore::addSourceTarget(InterfaceHandle handle,
                                 std::string_view targetName,
                                 InterfaceType hint)
{
    const auto* handleInfo = getHandleInfo(handle);
    if (handleInfo == nullptr) {
        throw(InvalidIdentifier("invalid handle"));
    }
    if (checkActionFlag(*handleInfo, source_only_flag)) {
        throw(InvalidIdentifier("Interface is receive only and cannot have destination targets"));
    }
    ActionMessage cmd;
    cmd.setSource(handleInfo->handle);
    cmd.counter = static_cast<uint16_t>(handleInfo->handleType);
    cmd.flags = handleInfo->flags;
    cmd.payload = targetName;
    switch (handleInfo->handleType) {
        case InterfaceType::ENDPOINT:
        case InterfaceType::SINK:
            if (hint == InterfaceType::FILTER) {
                cmd.setAction(CMD_ADD_NAMED_FILTER);
            } else if (hint == InterfaceType::PUBLICATION) {
                cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
            } else {
                cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            }
            break;

        case InterfaceType::TRANSLATOR:
            switch (hint) {
                case InterfaceType::PUBLICATION:
                    cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
                    break;

                case InterfaceType::INPUT:
                    throw(InvalidIdentifier("translators cannot have inputs as a source"));
                    break;
                case InterfaceType::ENDPOINT:
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    break;
                case InterfaceType::FILTER:
                    cmd.setAction(CMD_ADD_NAMED_FILTER);
                    break;
                default:
                    // translators can have two inputs
                    cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
                    addActionMessage(cmd);
                    cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
                    break;
            }
            break;
        case InterfaceType::FILTER:
            cmd.setAction(CMD_ADD_NAMED_ENDPOINT);
            if (handleInfo->key.empty()) {
                if ((!handleInfo->type_in.empty()) || (!handleInfo->type_out.empty())) {
                    cmd.setStringData(handleInfo->type_in, handleInfo->type_out);
                }
            }
            if (checkActionFlag(*handleInfo, clone_flag)) {
                setActionFlag(cmd, clone_flag);
            }
            break;
        case InterfaceType::INPUT:
            cmd.setAction(CMD_ADD_NAMED_PUBLICATION);
            break;
        case InterfaceType::PUBLICATION:
        default:
            throw(InvalidIdentifier("publications cannot have source targets"));
    }
    addActionMessage(std::move(cmd));
}